

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reqrep.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  uint *puVar8;
  bool bVar9;
  undefined4 local_30;
  undefined1 local_2b [3];
  int timeo;
  char cStack_24;
  char buf [7];
  int resend_ivl;
  int req2;
  int req1;
  int rep2;
  int rep1;
  int rc;
  
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x2a,1,0x31);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x2b,iVar2,"inproc://test");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x2c,1,0x30);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x2d,iVar3,"inproc://test");
  buf._3_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                               ,0x2e,1,0x30);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x2f,buf._3_4_,"inproc://test");
  iVar4 = nn_send(iVar2,"ABC",3,0);
  bVar9 = false;
  if (iVar4 == -1) {
    iVar4 = nn_errno();
    bVar9 = iVar4 == 0x9523dfe;
  }
  if (!bVar9) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == EFSM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
            ,0x33);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar4 = nn_recv(iVar3,local_2b,7,0);
  bVar9 = false;
  if (iVar4 == -1) {
    iVar4 = nn_errno();
    bVar9 = iVar4 == 0x9523dfe;
  }
  if (!bVar9) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == EFSM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
            ,0x35);
    fflush(_stderr);
    nn_err_abort();
  }
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x38,buf._3_4_,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x39,iVar2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x3a,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x3b,buf._3_4_,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x3d,iVar3,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x3e,iVar2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x3f,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x40,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x42,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x43,iVar3);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x44,buf._3_4_);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x47,1,0x30);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x48,iVar2,"inproc://test");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x49,1,0x31);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x4a,iVar3,"inproc://test");
  iVar4 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x4b,1,0x31);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x4c,iVar4,"inproc://test");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x4e,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x4f,iVar3,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x50,iVar3,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x51,iVar2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x53,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x54,iVar4,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x55,iVar4,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x56,iVar2,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x58,iVar4);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x59,iVar3);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x5a,iVar2);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x5d,1,0x31);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x5e,iVar2,"inproc://test");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x5f,1,0x30);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x60,iVar3,"inproc://test");
  cStack_24 = 'd';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  iVar4 = nn_setsockopt(iVar3,0x30,1,&stack0xffffffffffffffdc,4);
  pFVar1 = _stderr;
  if (iVar4 != 0) {
    piVar6 = __errno_location();
    pcVar7 = nn_err_strerror(*piVar6);
    puVar8 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
            ,100);
    fflush(_stderr);
    nn_err_abort();
  }
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x66,iVar3,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x67,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x69,iVar2,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x6b,iVar3);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x6c,iVar2);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x71,1,0x30);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x72,iVar2,"inproc://test");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x73,iVar2,"ABC");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x75,1,0x31);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x76,iVar3,"inproc://test");
  local_30 = 200;
  iVar4 = nn_setsockopt(iVar3,0,5,&local_30,4);
  pFVar1 = _stderr;
  if (iVar4 != 0) {
    piVar6 = __errno_location();
    pcVar7 = nn_err_strerror(*piVar6);
    puVar8 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
            ,0x7a);
    fflush(_stderr);
    nn_err_abort();
  }
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x7b,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x7d,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x7e,iVar3);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x83,1,0x30);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x84,iVar2,"inproc://test");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x85,1,0x31);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x86,iVar3,"inproc://test");
  iVar4 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0x87,1,0x31);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0x88,iVar4,"inproc://test");
  local_30 = 200;
  iVar5 = nn_setsockopt(iVar3,0,5,&local_30,4);
  pFVar1 = _stderr;
  if (iVar5 != 0) {
    piVar6 = __errno_location();
    pcVar7 = nn_err_strerror(*piVar6);
    puVar8 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
            ,0x8d);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar5 = nn_setsockopt(iVar4,0,5,&local_30,4);
  pFVar1 = _stderr;
  if (iVar5 != 0) {
    piVar6 = __errno_location();
    pcVar7 = nn_err_strerror(*piVar6);
    puVar8 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar7,(ulong)*puVar8,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
            ,0x90);
    fflush(_stderr);
    nn_err_abort();
  }
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x92,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x94,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x96,iVar3);
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x98,iVar4,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x9a,iVar4,"REPLY");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0x9b,iVar2,"REPLY");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x9e,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0x9f,iVar4);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0xa3,1,0x30);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                    ,0xa4,iVar2,"inproc://test");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0xa5,iVar2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0xa6,iVar2,"DEF");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                           ,0xa8,1,0x31);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0xa9,iVar3,"inproc://test");
  local_30 = 100;
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                 ,0xae,iVar3,"DEF");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0xb0,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                  ,0xb1,iVar3);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int rep1;
    int rep2;
    int req1;
    int req2;
    int resend_ivl;
    char buf [7];
    int timeo;

    /*  Test req/rep with full socket types. */
    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    req2 = test_socket (AF_SP, NN_REQ);
    test_connect (req2, SOCKET_ADDRESS);

    /*  Check invalid sequence of sends and recvs. */
    rc = nn_send (rep1, "ABC", 3, 0);
    nn_assert (rc == -1 && nn_errno () == EFSM);
    rc = nn_recv (req1, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == EFSM);

    /*  Check fair queueing the requests. */
    test_send (req2, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req2, "ABC");

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req1, "ABC");

    test_close (rep1);
    test_close (req1);
    test_close (req2);

    /*  Check load-balancing of requests. */
    req1 = test_socket (AF_SP, NN_REQ);
    test_bind (req1, SOCKET_ADDRESS);
    rep1 = test_socket (AF_SP, NN_REP);
    test_connect (rep1, SOCKET_ADDRESS);
    rep2 = test_socket (AF_SP, NN_REP);
    test_connect (rep2, SOCKET_ADDRESS);

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req1, "ABC");

    test_send (req1, "ABC");
    test_recv (rep2, "ABC");
    test_send (rep2, "ABC");
    test_recv (req1, "ABC");

    test_close (rep2);
    test_close (rep1);
    test_close (req1);

    /*  Test re-sending of the request. */
    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    resend_ivl = 100;
    rc = nn_setsockopt (req1, NN_REQ, NN_REQ_RESEND_IVL,
        &resend_ivl, sizeof (resend_ivl));
    errno_assert (rc == 0);

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    /*  The following waits for request to be resent  */
    test_recv (rep1, "ABC");

    test_close (req1);
    test_close (rep1);

    /*  Check sending a request when the peer is not available. (It should
        be sent immediatelly when the peer comes online rather than relying
        on the resend algorithm. */
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    test_send (req1, "ABC");

    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    timeo = 200;
    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);
    test_recv (rep1, "ABC");

    test_close (req1);
    test_close (rep1);

    /*  Check removing socket request sent to (It should
        be sent immediatelly to other peer rather than relying
        on the resend algorithm). */
    req1 = test_socket (AF_SP, NN_REQ);
    test_bind (req1, SOCKET_ADDRESS);
    rep1 = test_socket (AF_SP, NN_REP);
    test_connect (rep1, SOCKET_ADDRESS);
    rep2 = test_socket (AF_SP, NN_REP);
    test_connect (rep2, SOCKET_ADDRESS);

    timeo = 200;
    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);
    rc = nn_setsockopt (rep2, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);

    test_send (req1, "ABC");
    /*  We got request through rep1  */
    test_recv (rep1, "ABC");
    /*  But instead replying we simulate crash  */
    test_close (rep1);
    /*  The rep2 should get request immediately  */
    test_recv (rep2, "ABC");
    /*  Let's check it's delivered well  */
    test_send (rep2, "REPLY");
    test_recv (req1, "REPLY");


    test_close (req1);
    test_close (rep2);

    /*  Test cancelling delayed request  */

    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    test_send (req1, "ABC");
    test_send (req1, "DEF");

    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    timeo = 100;
//    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
//       &timeo, sizeof (timeo));
//    errno_assert (rc == 0);
    test_recv (rep1, "DEF");

    test_close (req1);
    test_close (rep1);

    return 0;
}